

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall r_code::SysView::SysView(SysView *this,View *source)

{
  Atom *this_00;
  size_t i_1;
  View *a;
  long lVar1;
  size_t i;
  size_t i_00;
  
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject)._vptr_ImageObject = (_func_int **)&PTR__ImageObject_0010dc40;
  a = source + 0x28;
  for (i_00 = 0; i_00 != 0xd; i_00 = i_00 + 1) {
    this_00 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i_00);
    Atom::operator=(this_00,(Atom *)a);
    a = a + 4;
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    if (*(long *)(source + lVar1 * 8 + 0x10) != 0) {
      vector<unsigned_int>::push_back(&(this->super_ImageObject).references,0);
    }
  }
  return;
}

Assistant:

SysView::SysView(View *source)
{
    for (size_t i = 0; i < VIEW_CODE_MAX_SIZE; ++i) {
        code[i] = source->code(i);
    }

    for (size_t i = 0; i < 2; ++i) // to get the right size in Image::add_object().
        if (source->references[i]) {
            references.push_back(0);
        }
}